

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileInfo.cpp
# Opt level: O3

bool __thiscall efsw::FileInfo::exists(FileInfo *this)

{
  bool bVar1;
  int iVar2;
  stat st;
  stat local_a0;
  
  bVar1 = FileSystem::slashAtEnd(&this->Filepath);
  if (bVar1) {
    FileSystem::dirRemoveSlashAtEnd(&this->Filepath);
    iVar2 = stat((this->Filepath)._M_dataplus._M_p,&local_a0);
    FileSystem::dirAddSlashAtEnd(&this->Filepath);
  }
  else {
    iVar2 = stat((this->Filepath)._M_dataplus._M_p,&local_a0);
  }
  return iVar2 == 0;
}

Assistant:

bool FileInfo::exists() {
	bool slashAtEnd = FileSystem::slashAtEnd( Filepath );

	if ( slashAtEnd ) {
		FileSystem::dirRemoveSlashAtEnd( Filepath );
	}

#if EFSW_PLATFORM != EFSW_PLATFORM_WIN32
	struct stat st;
	int res = stat( Filepath.c_str(), &st );
#else
	struct _stat st;
	int res = _wstat( String::fromUtf8( Filepath ).toWideString().c_str(), &st );
#endif

	if ( slashAtEnd ) {
		FileSystem::dirAddSlashAtEnd( Filepath );
	}

	return 0 == res;
}